

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error.h
# Opt level: O0

void __thiscall nodecpp::error::system_error::system_error(system_error *this,errc code)

{
  error_value *value_;
  std_error_value local_68;
  errc local_14;
  system_error *psStack_10;
  errc code_local;
  system_error *this_local;
  
  local_14 = code;
  psStack_10 = this;
  std_error_value::std_error_value(&local_68,code);
  value_ = std_error_domain::create_value((std_error_domain *)&std_error_domain_obj,&local_68);
  error::error(&this->super_error,(error_domain *)&std_error_domain_obj,value_);
  std_error_value::~std_error_value(&local_68);
  return;
}

Assistant:

system_error(errc code) : error( &std_error_domain_obj, std_error_domain_obj.create_value(code) ) {}